

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handle
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  bool bVar1;
  VkShaderModule_T *pVVar2;
  Hash local_60;
  Hash h_1;
  Hash h;
  WorkItem record_item;
  VkShaderModuleCreateInfo *module;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier;
  VkPipelineShaderStageCreateInfo *info_local;
  Impl *this_local;
  
  module = (VkShaderModuleCreateInfo *)0x0;
  if (this->module_identifier_database_iface != (DatabaseInterface *)0x0) {
    module = (VkShaderModuleCreateInfo *)
             find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>
                       (VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT,
                        info->pNext);
  }
  if (info->module == (VkShaderModule)0x0) {
    record_item.custom_hash =
         (Hash)find_pnext<VkShaderModuleCreateInfo>
                         (VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,info->pNext);
    if ((VkShaderModuleCreateInfo *)record_item.custom_hash == (VkShaderModuleCreateInfo *)0x0) {
      if (module == (VkShaderModuleCreateInfo *)0x0) {
        return false;
      }
      local_60 = 0;
      bVar1 = get_hash_for_shader_module
                        (this,(VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)module,&local_60
                        );
      if (!bVar1) {
        return false;
      }
      pVVar2 = api_object_cast<VkShaderModule_T*,unsigned_long>(local_60);
      info->module = pVVar2;
      register_on_use(this,RESOURCE_SHADER_MODULE,local_60);
    }
    else {
      memset(&h,0,0x20);
      record_item.handle = record_item.custom_hash;
      h_1 = record_shader_module(this,(WorkItem *)&h,true);
      pVVar2 = api_object_cast<VkShaderModule_T*,unsigned_long>(h_1);
      info->module = pVVar2;
    }
  }
  else {
    bVar1 = remap_shader_module_handle(this,info->module,&info->module);
    if (!bVar1) {
      return false;
    }
  }
  if (module != (VkShaderModuleCreateInfo *)0x0) {
    register_module_identifier
              (this,info->module,(VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)module);
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handle(VkPipelineShaderStageCreateInfo &info)
{
	const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier = nullptr;
	if (module_identifier_database_iface)
	{
		identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, info.pNext);
	}

	if (info.module != VK_NULL_HANDLE)
	{
		if (!remap_shader_module_handle(info.module, &info.module))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, info.pNext))
	{
		WorkItem record_item = {};
		record_item.create_info = const_cast<VkShaderModuleCreateInfo *>(module);
		Hash h = record_shader_module(record_item, true);
		info.module = api_object_cast<VkShaderModule>(h);
	}
	else if (identifier)
	{
		Hash h = 0;
		if (!get_hash_for_shader_module(identifier, &h))
			return false;
		info.module = api_object_cast<VkShaderModule>(h);
		register_on_use(RESOURCE_SHADER_MODULE, h);
	}
	else
		return false;

	if (identifier)
		register_module_identifier(info.module, *identifier);

	return true;
}